

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::~IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  IfcElement *this_00;
  char *pcVar1;
  long lVar2;
  undefined1 *puVar3;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                              super_IfcDistributionElement.super_IfcElement.super_IfcProduct.
                              super_IfcObject + -0x18);
  this_00 = (IfcElement *)
            ((long)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                    super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 + lVar2);
  pcVar1 = (this->UserDefinedFunction).ptr.field_2._M_local_buf + lVar2;
  pcVar1[-0x1a8] = -0x38;
  pcVar1[-0x1a7] = '\x10';
  pcVar1[-0x1a6] = -100;
  pcVar1[-0x1a5] = '\0';
  pcVar1[-0x1a4] = '\0';
  pcVar1[-0x1a3] = '\0';
  pcVar1[-0x1a2] = '\0';
  pcVar1[-0x1a1] = '\0';
  pcVar1[0x18] = '0';
  pcVar1[0x19] = '\x12';
  pcVar1[0x1a] = -100;
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[-0x120] = -0x10;
  pcVar1[-0x11f] = '\x10';
  pcVar1[-0x11e] = -100;
  pcVar1[-0x11d] = '\0';
  pcVar1[-0x11c] = '\0';
  pcVar1[-0x11b] = '\0';
  pcVar1[-0x11a] = '\0';
  pcVar1[-0x119] = '\0';
  pcVar1[-0x110] = '\x18';
  pcVar1[-0x10f] = '\x11';
  pcVar1[-0x10e] = -100;
  pcVar1[-0x10d] = '\0';
  pcVar1[-0x10c] = '\0';
  pcVar1[-0x10b] = '\0';
  pcVar1[-0x10a] = '\0';
  pcVar1[-0x109] = '\0';
  pcVar1[-0xd8] = '@';
  pcVar1[-0xd7] = '\x11';
  pcVar1[-0xd6] = -100;
  pcVar1[-0xd5] = '\0';
  pcVar1[-0xd4] = '\0';
  pcVar1[-0xd3] = '\0';
  pcVar1[-0xd2] = '\0';
  pcVar1[-0xd1] = '\0';
  pcVar1[-0xa8] = 'h';
  pcVar1[-0xa7] = '\x11';
  pcVar1[-0xa6] = -100;
  pcVar1[-0xa5] = '\0';
  pcVar1[-0xa4] = '\0';
  pcVar1[-0xa3] = '\0';
  pcVar1[-0xa2] = '\0';
  pcVar1[-0xa1] = '\0';
  pcVar1[-0x70] = -0x70;
  pcVar1[-0x6f] = '\x11';
  pcVar1[-0x6e] = -100;
  pcVar1[-0x6d] = '\0';
  pcVar1[-0x6c] = '\0';
  pcVar1[-0x6b] = '\0';
  pcVar1[-0x6a] = '\0';
  pcVar1[-0x69] = '\0';
  pcVar1[-0x60] = -0x48;
  pcVar1[-0x5f] = '\x11';
  pcVar1[-0x5e] = -100;
  pcVar1[-0x5d] = '\0';
  pcVar1[-0x5c] = '\0';
  pcVar1[-0x5b] = '\0';
  pcVar1[-0x5a] = '\0';
  pcVar1[-0x59] = '\0';
  pcVar1[-0x50] = -0x20;
  pcVar1[-0x4f] = '\x11';
  pcVar1[-0x4e] = -100;
  pcVar1[-0x4d] = '\0';
  pcVar1[-0x4c] = '\0';
  pcVar1[-0x4b] = '\0';
  pcVar1[-0x4a] = '\0';
  pcVar1[-0x49] = '\0';
  pcVar1[-0x40] = '\b';
  pcVar1[-0x3f] = '\x12';
  pcVar1[-0x3e] = -100;
  pcVar1[-0x3d] = '\0';
  pcVar1[-0x3c] = '\0';
  pcVar1[-0x3b] = '\0';
  pcVar1[-0x3a] = '\0';
  pcVar1[-0x39] = '\0';
  if (*(char **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(char **)(pcVar1 + -0x10));
  }
  puVar3 = *(undefined1 **)&this_00[1].super_IfcProduct.super_IfcObject.field_0x28;
  if (puVar3 != &this_00[1].super_IfcProduct.super_IfcObject.field_0x38) {
    operator_delete(puVar3);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__009c1260);
  operator_delete(this_00);
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}